

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

void save_to_check_buffer_and_close
               (cio_buffered_stream *bs,void *context,cio_error err,cio_read_buffer *buffer,
               size_t num_bytes)

{
  size_t num_bytes_local;
  cio_read_buffer *buffer_local;
  cio_error err_local;
  void *context_local;
  cio_buffered_stream *bs_local;
  
  save_to_check_buffer(bs,context,err,buffer,num_bytes);
  cio_buffered_stream_close(bs);
  return;
}

Assistant:

static void save_to_check_buffer_and_close(struct cio_buffered_stream *bs, void *context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	save_to_check_buffer(bs, context, err, buffer, num_bytes);
	cio_buffered_stream_close(bs);
}